

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O2

int VP8ParseIntraModeRow(VP8BitReader *br,VP8Decoder *dec)

{
  uint8_t *puVar1;
  VP8MBData *pVVar2;
  byte bVar3;
  uint8_t uVar4;
  int iVar5;
  uint uVar6;
  uint8_t *puVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  
  puVar1 = dec->intra_l;
  for (lVar9 = 0; lVar9 < dec->mb_w; lVar9 = lVar9 + 1) {
    piVar10 = (int *)(dec->intra_t + lVar9 * 4);
    pVVar2 = dec->mb_data;
    if ((dec->segment_hdr).update_map == 0) {
      bVar3 = 0;
    }
    else {
      iVar5 = VP8GetBit(br,(uint)(dec->proba).segments[0]);
      if (iVar5 == 0) {
        iVar5 = VP8GetBit(br,(uint)(dec->proba).segments[1]);
        bVar3 = (byte)iVar5;
      }
      else {
        iVar5 = VP8GetBit(br,(uint)(dec->proba).segments[2]);
        bVar3 = (byte)iVar5 | 2;
      }
    }
    pVVar2[lVar9].segment = bVar3;
    if (dec->use_skip_proba != 0) {
      iVar5 = VP8GetBit(br,(uint)dec->skip_p);
      pVVar2[lVar9].skip = (uint8_t)iVar5;
    }
    iVar5 = VP8GetBit(br,0x91);
    pVVar2[lVar9].is_i4x4 = (byte)iVar5 ^ 1;
    if (iVar5 == 0) {
      puVar7 = pVVar2[lVar9].imodes;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        uVar12 = (ulong)puVar1[lVar8];
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          bVar3 = *(byte *)((long)piVar10 + lVar13);
          uVar6 = VP8GetBit(br,(uint)kBModesProba[bVar3][uVar12][0]);
          while (uVar11 = (uint)""[uVar6], (0xa2eaUL >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
            iVar5 = VP8GetBit(br,(uint)kBModesProba[bVar3][uVar12][uVar11]);
            uVar6 = iVar5 + uVar11 * 2;
          }
          uVar12 = (ulong)-uVar11;
          *(char *)((long)piVar10 + lVar13) = (char)-uVar11;
        }
        *(int *)puVar7 = *piVar10;
        puVar7 = puVar7 + 4;
        puVar1[lVar8] = (uint8_t)uVar12;
      }
    }
    else {
      iVar5 = VP8GetBit(br,0x9c);
      if (iVar5 == 0) {
        iVar5 = VP8GetBit(br,0xa3);
        bVar3 = (iVar5 != 0) * '\x02';
      }
      else {
        iVar5 = VP8GetBit(br,0x80);
        bVar3 = (iVar5 == 0) * '\x02' + 1;
      }
      pVVar2[lVar9].imodes[0] = bVar3;
      *piVar10 = (uint)bVar3 * 0x1010101;
      *(uint *)puVar1 = (uint)bVar3 * 0x1010101;
    }
    iVar5 = VP8GetBit(br,0x8e);
    if (iVar5 == 0) {
      uVar4 = '\0';
    }
    else {
      iVar5 = VP8GetBit(br,0x72);
      if (iVar5 == 0) {
        uVar4 = '\x02';
      }
      else {
        iVar5 = VP8GetBit(br,0xb7);
        uVar4 = (iVar5 == 0) * '\x02' + '\x01';
      }
    }
    pVVar2[lVar9].uvmode = uVar4;
  }
  return (int)((dec->br).eof == 0);
}

Assistant:

int VP8ParseIntraModeRow(VP8BitReader* const br, VP8Decoder* const dec) {
  int mb_x;
  for (mb_x = 0; mb_x < dec->mb_w; ++mb_x) {
    ParseIntraMode(br, dec, mb_x);
  }
  return !dec->br.eof;
}